

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

int __thiscall IfNeuron::addStimulus(IfNeuron *this,StochasticVariable *stochvar)

{
  int iVar1;
  Scalar *this_00;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  this_00 = (Scalar *)operator_new(0x150);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"1.0",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Scalar",&local_6a);
  Scalar::Scalar(this_00,1.0,&local_48,&local_68);
  iVar1 = DifferentialEquation::addTerm
                    (&this->ifneuronMembrane,(StochasticFunction *)this_00,stochvar);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

int IfNeuron::addStimulus( StochasticVariable *stochvar )
{
	return ifneuronMembrane.addTerm( new Scalar( 1.0, "1.0" ), stochvar );
}